

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  XmlFormatting fmt;
  allocator<char> local_39;
  string local_38;
  TestRunInfo *local_18;
  TestRunInfo *runInfo_local;
  JunitReporter *this_local;
  
  local_18 = runInfo;
  runInfo_local = (TestRunInfo *)this;
  CumulativeReporterBase<Catch::JunitReporter>::testRunStarting
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,runInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"testsuites",&local_39);
  fmt = operator|(Newline,Indent);
  XmlWriter::startElement(&this->xml,&local_38,fmt);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void JunitReporter::testRunStarting( TestRunInfo const& runInfo )  {
        CumulativeReporterBase::testRunStarting( runInfo );
        xml.startElement( "testsuites" );
    }